

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_imexgus.c
# Opt level: O0

SUNErrCode SUNAdaptController_Write_ImExGus(SUNAdaptController C,FILE *fptr)

{
  FILE *in_RSI;
  long *in_RDI;
  SUNContext_conflict sunctx_local_scope_;
  
  fprintf(in_RSI,"ImEx Gustafsson SUNAdaptController module:\n");
  fprintf(in_RSI,"  k1e = %.15g\n",*(undefined8 *)(*in_RDI + 0x10));
  fprintf(in_RSI,"  k2e = %.15g\n",*(undefined8 *)(*in_RDI + 0x18));
  fprintf(in_RSI,"  k1i = %.15g\n",*(undefined8 *)*in_RDI);
  fprintf(in_RSI,"  k2i = %.15g\n",*(undefined8 *)(*in_RDI + 8));
  fprintf(in_RSI,"  bias factor = %.15g\n",*(undefined8 *)(*in_RDI + 0x20));
  fprintf(in_RSI,"  previous error = %.15g\n",*(undefined8 *)(*in_RDI + 0x28));
  fprintf(in_RSI,"  previous step = %.15g\n",*(undefined8 *)(*in_RDI + 0x30));
  return 0;
}

Assistant:

SUNErrCode SUNAdaptController_Write_ImExGus(SUNAdaptController C, FILE* fptr)
{
  SUNFunctionBegin(C->sunctx);
  SUNAssert(fptr, SUN_ERR_ARG_CORRUPT);
  fprintf(fptr, "ImEx Gustafsson SUNAdaptController module:\n");
  fprintf(fptr, "  k1e = " SUN_FORMAT_G "\n", SACIMEXGUS_K1E(C));
  fprintf(fptr, "  k2e = " SUN_FORMAT_G "\n", SACIMEXGUS_K2E(C));
  fprintf(fptr, "  k1i = " SUN_FORMAT_G "\n", SACIMEXGUS_K1I(C));
  fprintf(fptr, "  k2i = " SUN_FORMAT_G "\n", SACIMEXGUS_K2I(C));
  fprintf(fptr, "  bias factor = " SUN_FORMAT_G "\n", SACIMEXGUS_BIAS(C));
  fprintf(fptr, "  previous error = " SUN_FORMAT_G "\n", SACIMEXGUS_EP(C));
  fprintf(fptr, "  previous step = " SUN_FORMAT_G "\n", SACIMEXGUS_HP(C));
  return SUN_SUCCESS;
}